

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeEstimatorUtils.cpp
# Opt level: O0

UnitQuaternion * pureQuaternion(Vector3 *bodyFixedFrameVelocityInInertialFrame)

{
  double *pdVar1;
  VectorFixSize<3U> *in_RSI;
  VectorFixSize<4U> *in_RDI;
  double dVar2;
  UnitQuaternion *p;
  
  iDynTree::VectorFixSize<4U>::VectorFixSize(in_RDI);
  pdVar1 = iDynTree::VectorFixSize<4U>::operator()(in_RDI,0);
  *pdVar1 = 0.0;
  dVar2 = iDynTree::VectorFixSize<3U>::operator()(in_RSI,0);
  pdVar1 = iDynTree::VectorFixSize<4U>::operator()(in_RDI,1);
  *pdVar1 = dVar2;
  dVar2 = iDynTree::VectorFixSize<3U>::operator()(in_RSI,1);
  pdVar1 = iDynTree::VectorFixSize<4U>::operator()(in_RDI,2);
  *pdVar1 = dVar2;
  dVar2 = iDynTree::VectorFixSize<3U>::operator()(in_RSI,2);
  pdVar1 = iDynTree::VectorFixSize<4U>::operator()(in_RDI,3);
  *pdVar1 = dVar2;
  return in_RDI;
}

Assistant:

iDynTree::UnitQuaternion pureQuaternion(const iDynTree::Vector3& bodyFixedFrameVelocityInInertialFrame)
{
    iDynTree::UnitQuaternion p;
    p(0) = 0;
    p(1) = bodyFixedFrameVelocityInInertialFrame(0);
    p(2) = bodyFixedFrameVelocityInInertialFrame(1);
    p(3) = bodyFixedFrameVelocityInInertialFrame(2);
    return p;
}